

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O3

Hop_Obj_t * Abc_NodeBuildFromMini(Hop_Man_t *pMan,If_Man_t *p,If_Cut_t *pCut,int fUseDsd)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  
  if (fUseDsd == 0) {
    iVar1 = If_CutSopBalanceEval(p,pCut,p->vArray);
  }
  else {
    iVar1 = If_CutDsdBalanceEval(p,pCut,p->vArray);
  }
  if (-1 < iVar1) {
    pHVar2 = Abc_NodeBuildFromMiniInt(pMan,p->vArray,(uint)(byte)pCut->field_0x1f);
    return pHVar2;
  }
  __assert_fail("Delay >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcIf.c"
                ,0x1a5,"Hop_Obj_t *Abc_NodeBuildFromMini(Hop_Man_t *, If_Man_t *, If_Cut_t *, int)")
  ;
}

Assistant:

Hop_Obj_t * Abc_NodeBuildFromMini( Hop_Man_t * pMan, If_Man_t * p, If_Cut_t * pCut, int fUseDsd )
{
    int Delay;
    if ( fUseDsd )
        Delay = If_CutDsdBalanceEval( p, pCut, p->vArray );
    else
        Delay = If_CutSopBalanceEval( p, pCut, p->vArray );
    assert( Delay >= 0 );
    return Abc_NodeBuildFromMiniInt( pMan, p->vArray, If_CutLeaveNum(pCut) );
}